

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O3

void test_convert<double,float>(uint length,double value)

{
  float fVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 (*pauVar10) [16];
  undefined8 *puVar11;
  undefined1 (*pauVar12) [16];
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  float fVar20;
  shared_ptr<double> pt;
  shared_ptr<float> pu;
  
  uVar16 = (ulong)length;
  uVar14 = uVar16 * 8;
  if ((int)length < 0) {
    uVar14 = 0xffffffffffffffff;
  }
  uVar15 = uVar16 * 4;
  if ((int)length < 0) {
    uVar15 = 0xffffffffffffffff;
  }
  pauVar10 = (undefined1 (*) [16])operator_new__(uVar14);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt,pauVar10,nosimd::common::free<double>
            );
  pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar15);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu,
             pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<float>);
  uVar18 = SUB84(value,0);
  uVar19 = (undefined4)((ulong)value >> 0x20);
  pauVar12 = pauVar10;
  uVar17 = length;
  uVar13 = length;
  if (7 < (int)length) {
    do {
      auVar3._8_4_ = uVar18;
      auVar3._0_8_ = value;
      auVar3._12_4_ = uVar19;
      *pauVar12 = auVar3;
      auVar4._8_4_ = uVar18;
      auVar4._0_8_ = value;
      auVar4._12_4_ = uVar19;
      pauVar12[1] = auVar4;
      auVar5._8_4_ = uVar18;
      auVar5._0_8_ = value;
      auVar5._12_4_ = uVar19;
      pauVar12[2] = auVar5;
      auVar6._8_4_ = uVar18;
      auVar6._0_8_ = value;
      auVar6._12_4_ = uVar19;
      pauVar12[3] = auVar6;
      uVar13 = uVar17 - 8;
      pauVar12 = pauVar12 + 4;
      bVar2 = 0xf < uVar17;
      uVar17 = uVar13;
    } while (bVar2);
  }
  if (3 < (int)uVar13) {
    auVar7._8_4_ = uVar18;
    auVar7._0_8_ = value;
    auVar7._12_4_ = uVar19;
    *pauVar12 = auVar7;
    auVar8._8_4_ = uVar18;
    auVar8._0_8_ = value;
    auVar8._12_4_ = uVar19;
    pauVar12[1] = auVar8;
    uVar13 = uVar13 - 4;
    pauVar12 = pauVar12 + 2;
  }
  if (1 < (int)uVar13) {
    auVar9._8_4_ = uVar18;
    auVar9._0_8_ = value;
    auVar9._12_4_ = uVar19;
    *pauVar12 = auVar9;
    uVar13 = uVar13 - 2;
    pauVar12 = pauVar12 + 1;
  }
  if (uVar13 != 0) {
    *(double *)*pauVar12 = value;
  }
  if (0 < (int)length) {
    uVar14 = 0;
    do {
      *(float *)((long)&(pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + uVar14 * 4) =
           (float)*(double *)(*pauVar10 + uVar14 * 8);
      uVar14 = uVar14 + 1;
    } while (uVar16 != uVar14);
  }
  if (length != 0) {
    uVar14 = 0;
    do {
      fVar1 = *(float *)((long)&(pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar14 * 4);
      fVar20 = fVar1 - (float)value;
      uVar17 = -(uint)(fVar20 < 0.0);
      if (1.1920929e-07 <= (float)(~uVar17 & (uint)fVar20 | (uint)((float)value - fVar1) & uVar17))
      {
        puVar11 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar11 = "void test_convert(unsigned int, _T) [_T = double, _U = float]";
        *(undefined4 *)(puVar11 + 1) = 0x17;
        *(uint *)((long)puVar11 + 0xc) = length;
        __cxa_throw(puVar11,&Exception::typeinfo,0);
      }
      uVar14 = uVar14 + 1;
    } while (uVar16 != uVar14);
  }
  if (pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}